

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O2

UBool __thiscall icu_63::UStringSet::adopt(UStringSet *this,UnicodeString *str,UErrorCode *status)

{
  UBool UVar1;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (UVar1 = UVector::contains(&this->super_UVector,str), UVar1 == '\0')) {
    UVector::sortedInsert(&this->super_UVector,str,compareUnicodeString,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      return '\x01';
    }
  }
  else if (str == (UnicodeString *)0x0) {
    return '\0';
  }
  (*(str->super_Replaceable).super_UObject._vptr_UObject[1])(str);
  return '\0';
}

Assistant:

inline UBool adopt(UnicodeString *str, UErrorCode &status) {
    if(U_FAILURE(status) || contains(*str)) {
      delete str;
      return false;
    } else {
      sortedInsert(str, compareUnicodeString, status);
      if(U_FAILURE(status)) {
        delete str;
        return false;
      }
      return true;
    }
  }